

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void kronrod_set(int order,double *xtab,double *weight)

{
  ostream *poVar1;
  double *weight_local;
  double *xtab_local;
  int order_local;
  
  if (order == 0xf) {
    *xtab = -0.9914553711208126;
    xtab[1] = -0.9491079123427585;
    xtab[2] = -0.8648644233597691;
    xtab[3] = -0.7415311855993943;
    xtab[4] = -0.5860872354676911;
    xtab[5] = -0.4058451513773972;
    xtab[6] = -0.207784955078985;
    xtab[7] = 0.0;
    xtab[8] = 0.207784955078985;
    xtab[9] = 0.4058451513773972;
    xtab[10] = 0.5860872354676911;
    xtab[0xb] = 0.7415311855993943;
    xtab[0xc] = 0.8648644233597691;
    xtab[0xd] = 0.9491079123427585;
    xtab[0xe] = 0.9914553711208126;
    *weight = 0.02293532201052922;
    weight[1] = 0.06309209262997854;
    weight[2] = 0.1047900103222502;
    weight[3] = 0.1406532597155259;
    weight[4] = 0.1690047266392679;
    weight[5] = 0.1903505780647854;
    weight[6] = 0.2044329400752989;
    weight[7] = 0.2094821410847278;
    weight[8] = 0.2044329400752989;
    weight[9] = 0.1903505780647854;
    weight[10] = 0.1690047266392679;
    weight[0xb] = 0.1406532597155259;
    weight[0xc] = 0.1047900103222502;
    weight[0xd] = 0.06309209262997854;
    weight[0xe] = 0.02293532201052922;
  }
  else if (order == 0x15) {
    *xtab = -0.9956571630258081;
    xtab[1] = -0.9739065285171717;
    xtab[2] = -0.9301574913557082;
    xtab[3] = -0.8650633666889845;
    xtab[4] = -0.7808177265864169;
    xtab[5] = -0.6794095682990244;
    xtab[6] = -0.5627571346686047;
    xtab[7] = -0.4333953941292472;
    xtab[8] = -0.2943928627014602;
    xtab[9] = -0.1488743389816312;
    xtab[10] = 0.0;
    xtab[0xb] = 0.1488743389816312;
    xtab[0xc] = 0.2943928627014602;
    xtab[0xd] = 0.4333953941292472;
    xtab[0xe] = 0.5627571346686047;
    xtab[0xf] = 0.6794095682990244;
    xtab[0x10] = 0.7808177265864169;
    xtab[0x11] = 0.8650633666889845;
    xtab[0x12] = 0.9301574913557082;
    xtab[0x13] = 0.9739065285171717;
    xtab[0x14] = 0.9956571630258081;
    *weight = 0.01169463886737187;
    weight[1] = 0.03255816230796473;
    weight[2] = 0.054755896574352;
    weight[3] = 0.07503967481091996;
    weight[4] = 0.09312545458369761;
    weight[5] = 0.1093871588022976;
    weight[6] = 0.1234919762620659;
    weight[7] = 0.1347092173114733;
    weight[8] = 0.1427759385770601;
    weight[9] = 0.1477391049013385;
    weight[10] = 0.1494455540029169;
    weight[0xb] = 0.1477391049013385;
    weight[0xc] = 0.1427759385770601;
    weight[0xd] = 0.1347092173114733;
    weight[0xe] = 0.1234919762620659;
    weight[0xf] = 0.1093871588022976;
    weight[0x10] = 0.09312545458369761;
    weight[0x11] = 0.07503967481091996;
    weight[0x12] = 0.054755896574352;
    weight[0x13] = 0.03255816230796473;
    weight[0x14] = 0.01169463886737187;
  }
  else if (order == 0x1f) {
    *xtab = -0.9980022986933971;
    xtab[1] = -0.9879925180204854;
    xtab[2] = -0.9677390756791391;
    xtab[3] = -0.937273392400706;
    xtab[4] = -0.8972645323440819;
    xtab[5] = -0.8482065834104272;
    xtab[6] = -0.790418501442466;
    xtab[7] = -0.72441773136017;
    xtab[8] = -0.650996741297417;
    xtab[9] = -0.5709721726085388;
    xtab[10] = -0.4850818636402397;
    xtab[0xb] = -0.3941513470775634;
    xtab[0xc] = -0.2991800071531688;
    xtab[0xd] = -0.2011940939974345;
    xtab[0xe] = -0.1011420669187175;
    xtab[0xf] = 0.0;
    xtab[0x10] = 0.1011420669187175;
    xtab[0x11] = 0.2011940939974345;
    xtab[0x12] = 0.2991800071531688;
    xtab[0x13] = 0.3941513470775634;
    xtab[0x14] = 0.4850818636402397;
    xtab[0x15] = 0.5709721726085388;
    xtab[0x16] = 0.650996741297417;
    xtab[0x17] = 0.72441773136017;
    xtab[0x18] = 0.790418501442466;
    xtab[0x19] = 0.8482065834104272;
    xtab[0x1a] = 0.8972645323440819;
    xtab[0x1b] = 0.937273392400706;
    xtab[0x1c] = 0.9677390756791391;
    xtab[0x1d] = 0.9879925180204854;
    xtab[0x1e] = 0.9980022986933971;
    *weight = 0.005377479872923349;
    weight[1] = 0.01500794732931612;
    weight[2] = 0.02546084732671532;
    weight[3] = 0.03534636079137585;
    weight[4] = 0.04458975132476488;
    weight[5] = 0.05348152469092809;
    weight[6] = 0.06200956780067064;
    weight[7] = 0.06985412131872826;
    weight[8] = 0.07684968075772038;
    weight[9] = 0.08308050282313302;
    weight[10] = 0.08856444305621176;
    weight[0xb] = 0.09312659817082532;
    weight[0xc] = 0.09664272698362368;
    weight[0xd] = 0.09917359872179196;
    weight[0xe] = 0.1007698455238756;
    weight[0xf] = 0.1013300070147915;
    weight[0x10] = 0.1007698455238756;
    weight[0x11] = 0.09917359872179196;
    weight[0x12] = 0.09664272698362368;
    weight[0x13] = 0.09312659817082532;
    weight[0x14] = 0.08856444305621176;
    weight[0x15] = 0.08308050282313302;
    weight[0x16] = 0.07684968075772038;
    weight[0x17] = 0.06985412131872826;
    weight[0x18] = 0.06200956780067064;
    weight[0x19] = 0.05348152469092809;
    weight[0x1a] = 0.04458975132476488;
    weight[0x1b] = 0.03534636079137585;
    weight[0x1c] = 0.02546084732671532;
    weight[0x1d] = 0.01500794732931612;
    weight[0x1e] = 0.005377479872923349;
  }
  else {
    if (order != 0x29) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"KRONROD_SET - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of ORDER = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,order);
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cerr,"  Legal values are 15, 21, 31 or 41.\n");
      exit(1);
    }
    *xtab = -0.9988590315882777;
    xtab[1] = -0.9931285991850949;
    xtab[2] = -0.9815078774502503;
    xtab[3] = -0.9639719272779138;
    xtab[4] = -0.9408226338317548;
    xtab[5] = -0.912234428251326;
    xtab[6] = -0.878276811252282;
    xtab[7] = -0.8391169718222188;
    xtab[8] = -0.7950414288375512;
    xtab[9] = -0.7463319064601508;
    xtab[10] = -0.6932376563347514;
    xtab[0xb] = -0.636053680726515;
    xtab[0xc] = -0.5751404468197103;
    xtab[0xd] = -0.5108670019508271;
    xtab[0xe] = -0.4435931752387251;
    xtab[0xf] = -0.3737060887154196;
    xtab[0x10] = -0.301627868114913;
    xtab[0x11] = -0.2277858511416451;
    xtab[0x12] = -0.1526054652409227;
    xtab[0x13] = -0.07652652113349732;
    xtab[0x14] = 0.0;
    xtab[0x15] = 0.07652652113349732;
    xtab[0x16] = 0.1526054652409227;
    xtab[0x17] = 0.2277858511416451;
    xtab[0x18] = 0.301627868114913;
    xtab[0x19] = 0.3737060887154196;
    xtab[0x1a] = 0.4435931752387251;
    xtab[0x1b] = 0.5108670019508271;
    xtab[0x1c] = 0.5751404468197103;
    xtab[0x1d] = 0.636053680726515;
    xtab[0x1e] = 0.6932376563347514;
    xtab[0x1f] = 0.7463319064601508;
    xtab[0x20] = 0.7950414288375512;
    xtab[0x21] = 0.8391169718222188;
    xtab[0x22] = 0.878276811252282;
    xtab[0x23] = 0.912234428251326;
    xtab[0x24] = 0.9408226338317548;
    xtab[0x25] = 0.9639719272779138;
    xtab[0x26] = 0.9815078774502503;
    xtab[0x27] = 0.9931285991850949;
    xtab[0x28] = 0.9988590315882777;
    *weight = 0.003073583718520532;
    weight[1] = 0.008600269855642943;
    weight[2] = 0.01462616925697125;
    weight[3] = 0.02038837346126652;
    weight[4] = 0.02588213360495116;
    weight[5] = 0.0312873067770328;
    weight[6] = 0.0366001697582008;
    weight[7] = 0.04166887332797369;
    weight[8] = 0.04643482186749767;
    weight[9] = 0.05094457392372869;
    weight[10] = 0.05519510534828599;
    weight[0xb] = 0.05911140088063957;
    weight[0xc] = 0.06265323755478117;
    weight[0xd] = 0.06583459713361842;
    weight[0xe] = 0.06864867292852161;
    weight[0xf] = 0.07105442355344407;
    weight[0x10] = 0.07303069033278667;
    weight[0x11] = 0.0745828754004992;
    weight[0x12] = 0.07570449768455667;
    weight[0x13] = 0.07637786767208074;
    weight[0x14] = 0.07660071191799966;
    weight[0x15] = 0.07637786767208074;
    weight[0x16] = 0.07570449768455667;
    weight[0x17] = 0.0745828754004992;
    weight[0x18] = 0.07303069033278667;
    weight[0x19] = 0.07105442355344407;
    weight[0x1a] = 0.06864867292852161;
    weight[0x1b] = 0.06583459713361842;
    weight[0x1c] = 0.06265323755478117;
    weight[0x1d] = 0.05911140088063957;
    weight[0x1e] = 0.05519510534828599;
    weight[0x1f] = 0.05094457392372869;
    weight[0x20] = 0.04643482186749767;
    weight[0x21] = 0.04166887332797369;
    weight[0x22] = 0.0366001697582008;
    weight[0x23] = 0.0312873067770328;
    weight[0x24] = 0.02588213360495116;
    weight[0x25] = 0.02038837346126652;
    weight[0x26] = 0.01462616925697125;
    weight[0x27] = 0.008600269855642943;
    weight[0x28] = 0.003073583718520532;
  }
  return;
}

Assistant:

void kronrod_set ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    KRONROD_SET sets abscissas and weights for Gauss-Kronrod quadrature.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAb[I) )
//
//    A Kronrod rule is used in conjunction with a lower order
//    Gauss rule, and provides an efficient error estimation.
//
//    The error may be estimated as the difference in the two integral
//    approximations.
//
//    The efficiency comes about because the Kronrod uses the abscissas
//    of the Gauss rule, thus saving on the number of function evaluations
//    necessary.  If the Kronrod rule were replaced by a Gauss rule of
//    the same order, a higher precision integral estimate would be
//    made, but the function would have to be evaluated at many more
//    points.
//
//    The Gauss Kronrod pair of rules involves an ( ORDER + 1 ) / 2
//    point Gauss-Legendre rule and an ORDER point Kronrod rule.
//    Thus, the 15 point Kronrod rule should be paired with the
//    Gauss-Legendre 7 point rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 May 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Robert Piessens, Elise de Doncker-Kapenger, 
//    Christian Ueberhuber, David Kahaner,
//    QUADPACK, A Subroutine Package for Automatic Integration,
//    Springer Verlag, 1983.
//
//  Parameters:
//
//    Input, int ORDER, the order, which may be
//    15, 21, 31 or 41, corresponding to Gauss-Legendre rules of
//    order 7, 10, 15 or 20.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  if ( order == 15 )
  {
    xtab[0] =  - 0.9914553711208126E+00;
    xtab[1] =  - 0.9491079123427585E+00;
    xtab[2] =  - 0.8648644233597691E+00;
    xtab[3] =  - 0.7415311855993944E+00;
    xtab[4] =  - 0.5860872354676911E+00;
    xtab[5] =  - 0.4058451513773972E+00;
    xtab[6] =  - 0.2077849550789850E+00;
    xtab[7] =    0.0E+00;
    xtab[8] =    0.2077849550789850E+00;
    xtab[9] =   0.4058451513773972E+00;
    xtab[10] =   0.5860872354676911E+00;
    xtab[11] =   0.7415311855993944E+00;
    xtab[12] =   0.8648644233597691E+00;
    xtab[13] =   0.9491079123427585E+00;
    xtab[14] =   0.9914553711208126E+00;

    weight[0] =  0.2293532201052922E-01;
    weight[1] =  0.6309209262997855E-01;
    weight[2] =  0.1047900103222502E+00;
    weight[3] =  0.1406532597155259E+00;
    weight[4] =  0.1690047266392679E+00;
    weight[5] =  0.1903505780647854E+00;
    weight[6] =  0.2044329400752989E+00;
    weight[7] =  0.2094821410847278E+00;
    weight[8] =  0.2044329400752989E+00;
    weight[9] = 0.1903505780647854E+00;
    weight[10] = 0.1690047266392679E+00;
    weight[11] = 0.1406532597155259E+00;
    weight[12] = 0.1047900103222502E+00;
    weight[13] = 0.6309209262997855E-01;
    weight[14] = 0.2293532201052922E-01;
  }
  else if ( order == 21 )
  {
    xtab[0] =  - 0.9956571630258081E+00;
    xtab[1] =  - 0.9739065285171717E+00;
    xtab[2] =  - 0.9301574913557082E+00;
    xtab[3] =  - 0.8650633666889845E+00;
    xtab[4] =  - 0.7808177265864169E+00;
    xtab[5] =  - 0.6794095682990244E+00;
    xtab[6] =  - 0.5627571346686047E+00;
    xtab[7] =  - 0.4333953941292472E+00;
    xtab[8] =  - 0.2943928627014602E+00;
    xtab[9] = - 0.1488743389816312E+00;
    xtab[10] =   0.0E+00;
    xtab[11] =   0.1488743389816312E+00;
    xtab[12] =   0.2943928627014602E+00;
    xtab[13] =   0.4333953941292472E+00;
    xtab[14] =   0.5627571346686047E+00;
    xtab[15] =   0.6794095682990244E+00;
    xtab[16] =   0.7808177265864169E+00;
    xtab[17] =   0.8650633666889845E+00;
    xtab[18] =   0.9301574913557082E+00;
    xtab[19] =   0.9739065285171717E+00;
    xtab[20] =   0.9956571630258081E+00;

    weight[0] =  0.1169463886737187E-01;
    weight[1] =  0.3255816230796473E-01;
    weight[2] =  0.5475589657435200E-01;
    weight[3] =  0.7503967481091995E-01;
    weight[4] =  0.9312545458369761E-01;
    weight[5] =  0.1093871588022976E+00;
    weight[6] =  0.1234919762620659E+00;
    weight[7] =  0.1347092173114733E+00;
    weight[8] =  0.1427759385770601E+00;
    weight[9] = 0.1477391049013385E+00;
    weight[10] = 0.1494455540029169E+00;
    weight[11] = 0.1477391049013385E+00;
    weight[12] = 0.1427759385770601E+00;
    weight[13] = 0.1347092173114733E+00;
    weight[14] = 0.1234919762620659E+00;
    weight[15] = 0.1093871588022976E+00;
    weight[16] = 0.9312545458369761E-01;
    weight[17] = 0.7503967481091995E-01;
    weight[18] = 0.5475589657435200E-01;
    weight[19] = 0.3255816230796473E-01;
    weight[20] = 0.1169463886737187E-01;
  }
  else if ( order == 31 )
  {
    xtab[0] =  - 0.9980022986933971E+00;
    xtab[1] =  - 0.9879925180204854E+00;
    xtab[2] =  - 0.9677390756791391E+00;
    xtab[3] =  - 0.9372733924007059E+00;
    xtab[4] =  - 0.8972645323440819E+00;
    xtab[5] =  - 0.8482065834104272E+00;
    xtab[6] =  - 0.7904185014424659E+00;
    xtab[7] =  - 0.7244177313601700E+00;
    xtab[8] =  - 0.6509967412974170E+00;
    xtab[9] = - 0.5709721726085388E+00;
    xtab[10] = - 0.4850818636402397E+00;
    xtab[11] = - 0.3941513470775634E+00;
    xtab[12] = - 0.2991800071531688E+00;
    xtab[13] = - 0.2011940939974345E+00;
    xtab[14] = - 0.1011420669187175E+00;
    xtab[15] =   0.0E+00;
    xtab[16] =   0.1011420669187175E+00;
    xtab[17] =   0.2011940939974345E+00;
    xtab[18] =   0.2991800071531688E+00;
    xtab[19] =   0.3941513470775634E+00;
    xtab[20] =   0.4850818636402397E+00;
    xtab[21] =   0.5709721726085388E+00;
    xtab[22] =   0.6509967412974170E+00;
    xtab[23] =   0.7244177313601700E+00;
    xtab[24] =   0.7904185014424659E+00;
    xtab[25] =   0.8482065834104272E+00;
    xtab[26] =   0.8972645323440819E+00;
    xtab[27] =   0.9372733924007059E+00;
    xtab[28] =   0.9677390756791391E+00;
    xtab[29] =   0.9879925180204854E+00;
    xtab[30] =   0.9980022986933971E+00;

    weight[0] =  0.5377479872923349E-02;
    weight[1] =  0.1500794732931612E-01;
    weight[2] =  0.2546084732671532E-01;
    weight[3] =  0.3534636079137585E-01;
    weight[4] =  0.4458975132476488E-01;
    weight[5] =  0.5348152469092809E-01;
    weight[6] =  0.6200956780067064E-01;
    weight[7] =  0.6985412131872826E-01;
    weight[8] =  0.7684968075772038E-01;
    weight[9] = 0.8308050282313302E-01;
    weight[10] = 0.8856444305621177E-01;
    weight[11] = 0.9312659817082532E-01;
    weight[12] = 0.9664272698362368E-01;
    weight[13] = 0.9917359872179196E-01;
    weight[14] = 0.1007698455238756E+00;
    weight[15] = 0.1013300070147915E+00;
    weight[16] = 0.1007698455238756E+00;
    weight[17] = 0.9917359872179196E-01;
    weight[18] = 0.9664272698362368E-01;
    weight[19] = 0.9312659817082532E-01;
    weight[20] = 0.8856444305621177E-01;
    weight[21] = 0.8308050282313302E-01;
    weight[22] = 0.7684968075772038E-01;
    weight[23] = 0.6985412131872826E-01;
    weight[24] = 0.6200956780067064E-01;
    weight[25] = 0.5348152469092809E-01;
    weight[26] = 0.4458975132476488E-01;
    weight[27] = 0.3534636079137585E-01;
    weight[28] = 0.2546084732671532E-01;
    weight[29] = 0.1500794732931612E-01;
    weight[30] = 0.5377479872923349E-02;
  }
  else if ( order == 41 )
  {
    xtab[0] =  - 0.9988590315882777E+00;
    xtab[1] =  - 0.9931285991850949E+00;
    xtab[2] =  - 0.9815078774502503E+00;
    xtab[3] =  - 0.9639719272779138E+00;
    xtab[4] =  - 0.9408226338317548E+00;
    xtab[5] =  - 0.9122344282513259E+00;
    xtab[6] =  - 0.8782768112522820E+00;
    xtab[7] =  - 0.8391169718222188E+00;
    xtab[8] =  - 0.7950414288375512E+00;
    xtab[9] = - 0.7463319064601508E+00;
    xtab[10] = - 0.6932376563347514E+00;
    xtab[11] = - 0.6360536807265150E+00;
    xtab[12] = - 0.5751404468197103E+00;
    xtab[13] = - 0.5108670019508271E+00;
    xtab[14] = - 0.4435931752387251E+00;
    xtab[15] = - 0.3737060887154196E+00;
    xtab[16] = - 0.3016278681149130E+00;
    xtab[17] = - 0.2277858511416451E+00;
    xtab[18] = - 0.1526054652409227E+00;
    xtab[19] = - 0.7652652113349733E-01;
    xtab[20] =   0.0E+00;
    xtab[21] =   0.7652652113349733E-01;
    xtab[22] =   0.1526054652409227E+00;
    xtab[23] =   0.2277858511416451E+00;
    xtab[24] =   0.3016278681149130E+00;
    xtab[25] =   0.3737060887154196E+00;
    xtab[26] =   0.4435931752387251E+00;
    xtab[27] =   0.5108670019508271E+00;
    xtab[28] =   0.5751404468197103E+00;
    xtab[29] =   0.6360536807265150E+00;
    xtab[30] =   0.6932376563347514E+00;
    xtab[31] =   0.7463319064601508E+00;
    xtab[32] =   0.7950414288375512E+00;
    xtab[33] =   0.8391169718222188E+00;
    xtab[34] =   0.8782768112522820E+00;
    xtab[35] =   0.9122344282513259E+00;
    xtab[36] =   0.9408226338317548E+00;
    xtab[37] =   0.9639719272779138E+00;
    xtab[38] =   0.9815078774502503E+00;
    xtab[39] =   0.9931285991850949E+00;
    xtab[40] =   0.9988590315882777E+00;

    weight[0] =  0.3073583718520532E-02;
    weight[1] =  0.8600269855642942E-02;
    weight[2] =  0.1462616925697125E-01;
    weight[3] =  0.2038837346126652E-01;
    weight[4] =  0.2588213360495116E-01;
    weight[5] =  0.3128730677703280E-01;
    weight[6] =  0.3660016975820080E-01;
    weight[7] =  0.4166887332797369E-01;
    weight[8] =  0.4643482186749767E-01;
    weight[9] = 0.5094457392372869E-01;
    weight[10] = 0.5519510534828599E-01;
    weight[11] = 0.5911140088063957E-01;
    weight[12] = 0.6265323755478117E-01;
    weight[13] = 0.6583459713361842E-01;
    weight[14] = 0.6864867292852162E-01;
    weight[15] = 0.7105442355344407E-01;
    weight[16] = 0.7303069033278667E-01;
    weight[17] = 0.7458287540049919E-01;
    weight[18] = 0.7570449768455667E-01;
    weight[19] = 0.7637786767208074E-01;
    weight[20] = 0.7660071191799966E-01;
    weight[21] = 0.7637786767208074E-01;
    weight[22] = 0.7570449768455667E-01;
    weight[23] = 0.7458287540049919E-01;
    weight[24] = 0.7303069033278667E-01;
    weight[25] = 0.7105442355344407E-01;
    weight[26] = 0.6864867292852162E-01;
    weight[27] = 0.6583459713361842E-01;
    weight[28] = 0.6265323755478117E-01;
    weight[29] = 0.5911140088063957E-01;
    weight[30] = 0.5519510534828599E-01;
    weight[31] = 0.5094457392372869E-01;
    weight[32] = 0.4643482186749767E-01;
    weight[33] = 0.4166887332797369E-01;
    weight[34] = 0.3660016975820080E-01;
    weight[35] = 0.3128730677703280E-01;
    weight[36] = 0.2588213360495116E-01;
    weight[37] = 0.2038837346126652E-01;
    weight[38] = 0.1462616925697125E-01;
    weight[39] = 0.8600269855642942E-02;
    weight[40] = 0.3073583718520532E-02;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "KRONROD_SET - Fatal error!\n";
    std::cerr << "  Illegal value of ORDER = " << order << "\n";
    std::cerr << "  Legal values are 15, 21, 31 or 41.\n";
    exit ( 1 );
  }

  return;
}